

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12extend.c
# Opt level: O2

void extend_plane_high(uint8_t *src8,int src_stride,int width,int height,int extend_top,
                      int extend_left,int extend_bottom,int extend_right,int v_start,int v_end)

{
  void *__src;
  undefined2 uVar1;
  size_t __n;
  long lVar2;
  undefined2 *puVar3;
  undefined2 *puVar4;
  size_t i;
  long lVar5;
  void *pvVar6;
  int iVar7;
  long lVar8;
  undefined2 *puVar9;
  bool bVar10;
  
  puVar3 = (undefined2 *)((long)(v_start * src_stride) * 2 + (long)src8 * 2);
  puVar4 = puVar3 + width;
  puVar9 = puVar3 + (long)width + -1;
  lVar2 = (long)extend_left;
  lVar8 = (long)src_stride;
  for (; v_start < v_end; v_start = v_start + 1) {
    uVar1 = *puVar3;
    for (lVar5 = -lVar2; lVar5 != 0; lVar5 = lVar5 + 1) {
      puVar3[lVar5] = uVar1;
    }
    uVar1 = *puVar9;
    for (lVar5 = 0; extend_right != lVar5; lVar5 = lVar5 + 1) {
      puVar4[lVar5] = uVar1;
    }
    puVar3 = puVar3 + lVar8;
    puVar9 = puVar9 + lVar8;
    puVar4 = puVar4 + lVar8;
  }
  __src = (void *)((long)src8 * 2 + lVar2 * -2);
  pvVar6 = (void *)((long)__src + (long)-(src_stride * extend_top) * 2);
  __n = (long)(extend_left + width + extend_right) * 2;
  iVar7 = 0;
  if (0 < extend_top) {
    iVar7 = extend_top;
  }
  while (bVar10 = iVar7 != 0, iVar7 = iVar7 + -1, bVar10) {
    memcpy(pvVar6,__src,__n);
    pvVar6 = (void *)((long)pvVar6 + lVar8 * 2);
  }
  lVar5 = (long)((height + -1) * src_stride);
  iVar7 = 0;
  if (0 < extend_bottom) {
    iVar7 = extend_bottom;
  }
  pvVar6 = (void *)((long)src8 * 2 + lVar5 * 2 + lVar8 * 2 + lVar2 * -2);
  while (bVar10 = iVar7 != 0, iVar7 = iVar7 + -1, bVar10) {
    memcpy(pvVar6,(void *)((long)__src + lVar5 * 2),__n);
    pvVar6 = (void *)((long)pvVar6 + lVar8 * 2);
  }
  return;
}

Assistant:

static void extend_plane_high(uint8_t *const src8, int src_stride, int width,
                              int height, int extend_top, int extend_left,
                              int extend_bottom, int extend_right, int v_start,
                              int v_end) {
  int i;
  const int linesize = extend_left + extend_right + width;
  assert(linesize <= src_stride);
  uint16_t *src = CONVERT_TO_SHORTPTR(src8);

  /* copy the left and right most columns out */
  uint16_t *src_ptr1 = src + v_start * src_stride;
  uint16_t *src_ptr2 = src + v_start * src_stride + width - 1;
  uint16_t *dst_ptr1 = src + v_start * src_stride - extend_left;
  uint16_t *dst_ptr2 = src_ptr2 + 1;

  for (i = v_start; i < v_end; ++i) {
    aom_memset16(dst_ptr1, src_ptr1[0], extend_left);
    aom_memset16(dst_ptr2, src_ptr2[0], extend_right);
    src_ptr1 += src_stride;
    src_ptr2 += src_stride;
    dst_ptr1 += src_stride;
    dst_ptr2 += src_stride;
  }

  /* Now copy the top and bottom lines into each line of the respective
   * borders
   */
  src_ptr1 = src - extend_left;
  dst_ptr1 = src_ptr1 + src_stride * -extend_top;

  for (i = 0; i < extend_top; ++i) {
    memcpy(dst_ptr1, src_ptr1, linesize * sizeof(uint16_t));
    dst_ptr1 += src_stride;
  }

  src_ptr2 = src_ptr1 + src_stride * (height - 1);
  dst_ptr2 = src_ptr2;

  for (i = 0; i < extend_bottom; ++i) {
    dst_ptr2 += src_stride;
    memcpy(dst_ptr2, src_ptr2, linesize * sizeof(uint16_t));
  }
}